

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

UniformInfiniteLight * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,Transform *args,SpectrumHandle *args_1,
          float *args_2,polymorphic_allocator<std::byte> *args_3)

{
  UniformInfiniteLight *pUVar1;
  polymorphic_allocator<std::byte> *in_RDX;
  float *in_RSI;
  SpectrumHandle *in_RDI;
  Transform *unaff_retaddr;
  UniformInfiniteLight *p;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffd0;
  
  pUVar1 = allocate_object<pbrt::UniformInfiniteLight>(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  construct<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (args_3,p,unaff_retaddr,in_RDI,in_RSI,in_RDX);
  return pUVar1;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }